

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_mtp2type_abbrev(compiler_state_t *cstate,int type)

{
  block *b0;
  block *pbVar1;
  bpf_u_int32 bVar2;
  bpf_u_int32 bVar3;
  char *fmt;
  bpf_u_int32 bVar4;
  bpf_u_int32 jtype;
  bpf_int32 v;
  
  switch(type) {
  case 0x16:
    if ((1 < cstate->linktype - 0x8bU) && (cstate->linktype != 0xc5)) {
      fmt = "\'fisu\' supported only on MTP2";
      goto LAB_001110d4;
    }
    bVar3 = cstate->off_li;
    bVar2 = 0x10;
    bVar4 = 0x3f;
    break;
  case 0x17:
    if ((cstate->linktype - 0x8bU < 2) || (cstate->linktype == 0xc5)) {
      pbVar1 = gen_ncmp(cstate,OR_PACKET,cstate->off_li,0x10,0x3f,0x20,1,2);
      bVar3 = cstate->off_li;
      bVar2 = 0x10;
      bVar4 = 0x3f;
LAB_0011102e:
      b0 = gen_ncmp(cstate,OR_PACKET,bVar3,bVar2,bVar4,0x20,0,0);
      gen_and(b0,pbVar1);
      return pbVar1;
    }
    fmt = "\'lssu\' supported only on MTP2";
    goto LAB_001110d4;
  case 0x18:
    if ((1 < cstate->linktype - 0x8bU) && (cstate->linktype != 0xc5)) {
      fmt = "\'msu\' supported only on MTP2";
      goto LAB_001110d4;
    }
    bVar3 = cstate->off_li;
    bVar2 = 0x10;
    bVar4 = 0x3f;
    v = 2;
    goto LAB_0011108a;
  case 0x19:
    if ((1 < cstate->linktype - 0x8bU) && (cstate->linktype != 0xc5)) {
      fmt = "\'hfisu\' supported only on MTP2_HSL";
      goto LAB_001110d4;
    }
    bVar3 = cstate->off_li_hsl;
    bVar2 = 8;
    bVar4 = 0xff80;
    break;
  case 0x1a:
    if ((cstate->linktype - 0x8bU < 2) || (cstate->linktype == 0xc5)) {
      pbVar1 = gen_ncmp(cstate,OR_PACKET,cstate->off_li_hsl,8,0xff80,0x20,1,0x100);
      bVar3 = cstate->off_li_hsl;
      bVar2 = 8;
      bVar4 = 0xff80;
      goto LAB_0011102e;
    }
    fmt = "\'hlssu\' supported only on MTP2_HSL";
LAB_001110d4:
    bpf_error(cstate,fmt);
  case 0x1b:
    if ((1 < cstate->linktype - 0x8bU) && (cstate->linktype != 0xc5)) {
      fmt = "\'hmsu\' supported only on MTP2_HSL";
      goto LAB_001110d4;
    }
    bVar3 = cstate->off_li_hsl;
    bVar2 = 8;
    bVar4 = 0xff80;
    v = 0x100;
LAB_0011108a:
    jtype = 0x20;
    goto LAB_0011108c;
  default:
    abort();
  }
  jtype = 0x10;
  v = 0;
LAB_0011108c:
  pbVar1 = gen_ncmp(cstate,OR_PACKET,bVar3,bVar2,bVar4,jtype,0,v);
  return pbVar1;
}

Assistant:

struct block *
gen_mtp2type_abbrev(compiler_state_t *cstate, int type)
{
	struct block *b0, *b1;

	switch (type) {

	case M_FISU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'fisu' supported only on MTP2");
		/* gen_ncmp(cstate, offrel, offset, size, mask, jtype, reverse, value) */
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JEQ, 0, 0);
		break;

	case M_LSSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'lssu' supported only on MTP2");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JGT, 1, 2);
		b1 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JGT, 0, 0);
		gen_and(b1, b0);
		break;

	case M_MSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'msu' supported only on MTP2");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JGT, 0, 2);
		break;

	case MH_FISU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'hfisu' supported only on MTP2_HSL");
		/* gen_ncmp(cstate, offrel, offset, size, mask, jtype, reverse, value) */
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JEQ, 0, 0);
		break;

	case MH_LSSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'hlssu' supported only on MTP2_HSL");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JGT, 1, 0x0100);
		b1 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JGT, 0, 0);
		gen_and(b1, b0);
		break;

	case MH_MSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'hmsu' supported only on MTP2_HSL");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JGT, 0, 0x0100);
		break;

	default:
		abort();
	}
	return b0;
}